

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.h
# Opt level: O1

bool axl::err::completeWithSystemError<bool>(bool result,bool failResult,uint_t errorCode)

{
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_28;
  
  if ((int)CONCAT71(in_register_00000031,failResult) == (int)CONCAT71(in_register_00000039,result))
  {
    Error::Error((Error *)&local_28,errorCode);
    local_48.m_p = (ErrorHdr *)0x0;
    local_48.m_hdr = (BufHdr *)0x0;
    local_48.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_48,&local_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_28);
    setError((ErrorRef *)&local_48);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
  }
  return result;
}

Assistant:

T
completeWithSystemError(
	T result,
	T failResult,
	uint_t errorCode
) {
	if (result == failResult)
		setError(errorCode);

	return result;
}